

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

uchar * Mnist_ReadImages1_(void)

{
  uchar *__ptr;
  FILE *__stream;
  size_t sVar1;
  
  __ptr = (uchar *)malloc(0x2cdc610);
  __stream = fopen("train-images.idx3-ubyte","rb");
  sVar1 = fread(__ptr,1,0x2cdc610,__stream);
  if ((int)sVar1 == 0x2cdc610) {
    fclose(__stream);
    return __ptr;
  }
  __assert_fail("RetValue == Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                ,0x3a0,"unsigned char *Mnist_ReadImages1_()");
}

Assistant:

unsigned char * Mnist_ReadImages1_()
{
    int Size = 60000 * 28 * 28 + 16;
    unsigned char * pData = (unsigned char *)malloc( Size );
    FILE * pFile = fopen( "train-images.idx3-ubyte", "rb" );
    int RetValue = fread( pData, 1, Size, pFile );
    assert( RetValue == Size );
    fclose( pFile );
    return pData;
}